

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_proto.c
# Opt level: O3

int synthetic_create_request(application_protocol *proto,request *req)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  long *in_FS_OFFSET;
  double __x;
  
  pvVar1 = proto->arg;
  lVar2 = *in_FS_OFFSET;
  if (in_FS_OFFSET[-0x2f] == 0) {
    pvVar3 = malloc(8);
    in_FS_OFFSET[-0x2f] = (long)pvVar3;
    if (pvVar3 == (void *)0x0) {
      __assert_fail("per_thread_arg",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                    ,0x69,
                    "int synthetic_create_request(struct application_protocol *, struct request *)")
      ;
    }
  }
  if (*(code **)((long)pvVar1 + 0x14) == (code *)0x0) {
    drand48();
    __x = (double)(**(code **)((long)pvVar1 + 0xc))(pvVar1);
  }
  else {
    __x = (double)(**(code **)((long)pvVar1 + 0x14))(pvVar1);
  }
  lVar4 = lround(__x);
  in_FS_OFFSET[-0x2f] = lVar4;
  req->iovs[0].iov_base = (void *)(lVar2 + -0x178);
  req->iovs[0].iov_len = 8;
  req->iov_cnt = 1;
  req->meta = (void *)0x0;
  return 0;
}

Assistant:

int synthetic_create_request(struct application_protocol *proto,
							 struct request *req)
{
	struct rand_gen *generator = (struct rand_gen *)proto->arg;

	if (!per_thread_arg) {
		per_thread_arg = malloc(sizeof(long));
		assert(per_thread_arg);
	}
	per_thread_arg = (void *)lround(generate(generator));
	req->iovs[0].iov_base = &per_thread_arg;
	req->iovs[0].iov_len = sizeof(long);
	req->iov_cnt = 1;
	req->meta = NULL;

	return 0;
}